

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O1

int colfromatomload(t_atom *colatom)

{
  char *__nptr;
  uint uVar1;
  ushort **ppuVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  t_float tVar8;
  
  if (colatom->a_type == A_SYMBOL) {
    ppuVar2 = __ctype_b_loc();
    __nptr = ((colatom->a_w).w_symbol)->s_name;
    lVar5 = (long)*__nptr;
    if ((lVar5 != 0x2d) && (((*ppuVar2)[lVar5] & 0x800) == 0)) goto LAB_001313de;
    uVar1 = atoi(__nptr);
  }
  else {
    if (colatom->a_type != A_FLOAT) {
LAB_001313de:
      iVar4 = iemgui_getcolorarg(0,1,colatom);
      return iVar4;
    }
    tVar8 = atom_getfloat(colatom);
    uVar1 = (uint)tVar8;
  }
  if ((int)uVar1 < 0) {
    uVar1 = ~uVar1;
    iVar4 = ((uVar1 & 0xfc0) << 4 | (uVar1 & 0x3f000) << 6) + (uVar1 & 0x3f) * 4;
  }
  else {
    uVar7 = 0x1d;
    if (0x1d < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    iVar4 = (int)(uVar7 / 0x1e);
    iVar6 = uVar1 + iVar4 * -0x1e;
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
    iVar4 = (iVar3 + iVar4 * 0x1e) - uVar1;
    uVar1 = (uint)(iVar4 != 0);
    iVar4 = iemgui_color_hex[((iVar4 - uVar1) / 0x1e + uVar1) * 0x1e + iVar6];
  }
  return iVar4;
}

Assistant:

static int colfromatomload(t_atom*colatom)
{
    int color;
        /* old-fashioned color argument, either a number or symbol
        evaluating to an integer */
    if (colatom->a_type == A_FLOAT)
        color = atom_getfloat(colatom);
    else if (colatom->a_type == A_SYMBOL &&
        (isdigit(colatom->a_w.w_symbol->s_name[0]) ||
            colatom->a_w.w_symbol->s_name[0] == '-'))
                color = atoi(colatom->a_w.w_symbol->s_name);

        /* symbolic color */
    else return (iemgui_getcolorarg(0, 1, colatom));
    if (color < 0)
    {
        color = -1 - color;
        color = ((color & 0x3f000) << 6)|((color & 0xfc0) << 4)|
            ((color & 0x3f) << 2);
    }
    else
    {
        color = iemgui_modulo_color(color);
        color = iemgui_color_hex[color];
    }
    return (color);
}